

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int is_prime(int num)

{
  int i;
  int num_local;
  uint local_4;
  
  for (i = 2; (i < num && (num % i != 0)); i = i + 1) {
  }
  local_4 = (uint)(i == num);
  return local_4;
}

Assistant:

int is_prime(int num) {
	int i;
	for (i = 2; i < num; i++) {
		if ((num % i) == 0) {
			break;
		}
	}
	if (i == num) {
		return 1;
	}
	return 0;
}